

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ast::SubroutineSymbol_const*,slang::ast::SubroutineSymbol_const*,std::hash<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::SubroutineSymbol_const*>>,std::equal_to<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::SubroutineSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>>
::emplace<slang::ast::SubroutineSymbol_const*>
          (sherwood_v3_table<slang::ast::SubroutineSymbol_const*,slang::ast::SubroutineSymbol_const*,std::hash<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::SubroutineSymbol_const*>>,std::equal_to<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::SubroutineSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>>
           *this,SubroutineSymbol **key)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
  pVar2;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
  pVar3;
  bool local_49;
  templated_iterator<const_slang::ast::SubroutineSymbol_*> local_48;
  char local_39;
  EntryPointer psStack_38;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  SubroutineSymbol **key_local;
  sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
  *this_local;
  bool local_10;
  
  index = (size_t)key;
  key_local = (SubroutineSymbol **)this;
  hash = hash_object<slang::ast::SubroutineSymbol_const*>(this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x18),hash,*(size_t *)(this + 0x10));
  psStack_38 = (EntryPointer)(*(long *)(this + 8) + (long)current_entry * 0x10);
  local_39 = '\0';
  do {
    if (psStack_38->distance_from_desired < local_39) {
      pVar2 = emplace_new_key<slang::ast::SubroutineSymbol_const*>
                        (this,local_39,psStack_38,(SubroutineSymbol **)index);
      local_10 = pVar2.second;
LAB_0066a082:
      this_local = (sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
                    *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<slang::ast::SubroutineSymbol_const*,slang::ast::SubroutineSymbol_const*>
                      (this,(SubroutineSymbol **)index,&(psStack_38->field_1).value);
    if (bVar1) {
      sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
      ::templated_iterator<const_slang::ast::SubroutineSymbol_*>::templated_iterator
                (&local_48,psStack_38);
      local_49 = false;
      std::
      pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
      ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
                          *)&this_local,&local_48,&local_49);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_0066a082;
    }
    psStack_38 = psStack_38 + 1;
    local_39 = local_39 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }